

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

bool ON_BytesToHexadecimalString
               (ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse,char *str,
               size_t str_capacity)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  char cVar8;
  bool bVar9;
  
  bVar9 = byte_count * 2 <= str_capacity;
  bVar1 = bVar9 && str != (char *)0x0;
  if (bVar9 && str != (char *)0x0) {
    cVar2 = !bCapitalDigits * ' ' + '7';
    pbVar6 = bytes + 0x13;
    if (!bReverse) {
      pbVar6 = bytes;
    }
    iVar5 = 0x14;
    uVar4 = 0;
    while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
      bVar7 = *pbVar6;
      if (uVar4 < str_capacity) {
        bVar3 = bVar7 >> 4 | 0x30;
        if (0x9f < bVar7) {
          bVar3 = (bVar7 >> 4) + cVar2;
        }
        str[uVar4] = bVar3;
        uVar4 = uVar4 + 1;
      }
      if (uVar4 < str_capacity) {
        bVar7 = bVar7 & 0xf;
        cVar8 = bVar7 + 0x30;
        if (9 < bVar7) {
          cVar8 = bVar7 + cVar2;
        }
        str[uVar4] = cVar8;
        uVar4 = uVar4 + 1;
      }
      pbVar6 = pbVar6 + (-(ulong)bReverse | 1);
    }
    if (str_capacity <= uVar4) {
      return bVar1;
    }
    str = str + uVar4;
  }
  else if (str == (char *)0x0 || str_capacity == 0) {
    return bVar1;
  }
  *str = '\0';
  return bVar1;
}

Assistant:

static bool ON_BytesToHexadecimalString(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse,
  char* str,
  size_t str_capacity
  )
{
  if (nullptr == str || str_capacity < 2*byte_count || byte_count <= 0 || nullptr == bytes )
  {
    if (nullptr != str && str_capacity > 0)
      str[0] = 0;
    return false;
  }
  const int A_minus_10 = (bCapitalDigits ? 'A' : 'a') - 10;
  size_t j = 0;
  int c;
  if ( bReverse )
    bytes += 19;
  const int delta_byte = bReverse ? -1 : 1;
  for (int i = 0; i < 20; i++)
  {
    ON__UINT8 b = *bytes;
    bytes += delta_byte;
    c = (int)(b / 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
    c = (int)(b % 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
  }
  if ((size_t)j < str_capacity)
    str[j] = 0;
  return true;
}